

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall Catch::AssertionResult::getTestMacroName_abi_cxx11_(AssertionResult *this)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string AssertionResult::getTestMacroName() const {
        return m_info.macroName;
    }